

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O1

BVIndex __thiscall BVStatic<4096UL>::GetNextBit(BVStatic<4096UL> *this,BVIndex i)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint index;
  
  AssertRange(this,i);
  AssertRange(this,i);
  uVar3 = i >> 6;
  index = i & 0x3f;
  BVUnitT<unsigned_long>::AssertRange(index);
  uVar5 = this->data[uVar3].word;
  BVUnitT<unsigned_long>::AssertRange(index);
  uVar5 = (uVar5 >> (sbyte)index) << (sbyte)index;
  if (uVar5 == 0) {
    uVar5 = (ulong)(uVar3 * 8);
    iVar4 = uVar3 * -0x40;
    do {
      if (uVar5 == 0x1f8) {
        return 0xffffffff;
      }
      uVar1 = *(ulong *)((long)&this->data[1].word + uVar5);
      uVar5 = uVar5 + 8;
      iVar4 = iVar4 + -0x40;
    } while (uVar1 == 0);
    lVar2 = 0;
    if (uVar1 != 0) {
      for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar3 = (int)lVar2 - iVar4;
  }
  else {
    lVar2 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar3 = (uint)lVar2 | i & 0xffffffc0;
  }
  return uVar3;
}

Assistant:

BVIndex GetNextBit(BVIndex i) const
    {
        AssertRange(i);

        const BVUnit * chunk = BitsFromIndex(i);
        BVIndex base = BVUnit::Floor(i);

        BVIndex offset = chunk->GetNextBit(BVUnit::Offset(i));
        if (-1 != offset)
        {
            return base + offset;
        }

        while (++chunk != this->EndUnit())
        {
            base += BVUnit::BitsPerWord;
            offset = chunk->GetNextBit();
            if (-1 != offset)
            {
                return base + offset;
            }
        }

       return BVInvalidIndex;
    }